

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O3

void __thiscall
bssl::anon_unknown_0::SSLVersionTest_RecordCallback_Test::TestBody
          (SSLVersionTest_RecordCallback_Test *this)

{
  tuple<ssl_ctx_st_*,_bssl::internal::Deleter> ctx;
  char cVar1;
  bool bVar2;
  ParamType *pPVar3;
  long lVar4;
  char *expected_predicate_value;
  ScopedTrace gtest_trace_4631;
  bool write_seen;
  bool read_seen;
  bool test_server;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  CallbackType cb;
  ScopedTrace local_e4;
  internal local_e3;
  internal local_e2;
  bool local_e1;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_e0;
  internal local_d8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d0;
  AssertHelper local_c8;
  byte local_ba [2];
  undefined1 local_b8 [16];
  undefined1 local_a8 [32];
  _Alloc_hider local_88;
  size_type sStack_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  char local_68 [16];
  AssertHelper local_58;
  internal *local_50;
  SSLVersionTest_RecordCallback_Test *local_48;
  UniquePtr<SSL> *local_40;
  UniquePtr<SSL> *local_38;
  
  pPVar3 = testing::WithParamInterface<bssl::(anonymous_namespace)::VersionParam>::GetParam();
  if (pPVar3->version != 0xfefc) {
    local_ba[0] = 1;
    local_ba[1] = 0;
    local_38 = &(this->super_SSLVersionTest).client_;
    local_40 = &(this->super_SSLVersionTest).server_;
    lVar4 = 0;
    do {
      local_e1 = (bool)local_ba[lVar4];
      testing::ScopedTrace::ScopedTrace<bool>
                (&local_e4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x1217,&local_e1);
      bVar2 = testing::internal::AlwaysTrue();
      if (!bVar2) {
LAB_0018efb0:
        testing::Message::Message((Message *)local_b8);
        testing::internal::AssertHelper::AssertHelper
                  (&local_58,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x1218,
                   "Expected: ResetContexts() doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
                  );
        testing::internal::AssertHelper::operator=(&local_58,(Message *)local_b8);
        testing::internal::AssertHelper::~AssertHelper(&local_58);
        if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             )local_b8._0_8_ !=
            (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             )0x0) {
          (**(code **)(*(long *)local_b8._0_8_ + 8))();
        }
LAB_0018f0be:
        testing::ScopedTrace::~ScopedTrace(&local_e4);
        return;
      }
      testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
                ((HasNewFatalFailureHelper *)local_b8);
      bVar2 = testing::internal::AlwaysTrue();
      if (bVar2) {
        SSLVersionTest::ResetContexts(&this->super_SSLVersionTest);
      }
      cVar1 = local_b8[8];
      testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
                ((HasNewFatalFailureHelper *)local_b8);
      if (cVar1 != '\0') goto LAB_0018efb0;
      local_e2 = (internal)0x0;
      local_e3 = (internal)0x0;
      local_58.data_ = (AssertHelperData *)&local_e3;
      local_50 = &local_e2;
      ctx.super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl =
           (&(this->super_SSLVersionTest).server_ctx_)[local_e1 ^ 1]._M_t.
           super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>;
      local_48 = this;
      SSL_CTX_set_msg_callback
                ((SSL_CTX *)
                 ctx.super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                 TestBody::anon_class_1_0_00000001::__invoke);
      SSL_CTX_set_msg_callback_arg
                ((SSL_CTX *)
                 ctx.super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,&local_58);
      local_a8._8_8_ = 0;
      local_a8._24_8_ = 0;
      sStack_80 = 0;
      local_78._8_8_ = 0;
      local_b8._0_8_ =
           (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )0x0;
      local_b8._8_8_ = (stack_st_CRYPTO_BUFFER *)0x0;
      local_a8._0_8_ = local_a8 + 0x10;
      local_a8._16_8_ = 0;
      local_78._M_allocated_capacity = 0;
      local_68[0] = '\0';
      local_68[1] = '\0';
      local_68[2] = '\0';
      local_68[3] = '\0';
      local_68[4] = '\0';
      local_68[5] = '\0';
      local_68[6] = '\0';
      local_68[7] = '\0';
      bVar2 = (this->super_SSLVersionTest).shed_handshake_config_;
      expected_predicate_value = (char *)(ulong)bVar2;
      local_88._M_p = (pointer)&local_78;
      local_d8[0] = (internal)
                    ConnectClientAndServer
                              (local_38,local_40,
                               (this->super_SSLVersionTest).client_ctx_._M_t.
                               super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                               super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                               (this->super_SSLVersionTest).server_ctx_._M_t.
                               super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                               super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                               (ClientConfig *)local_b8,bVar2);
      local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_p != &local_78) {
        operator_delete(local_88._M_p,local_78._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
        operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
      }
      if (local_d8[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_e0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_b8,local_d8,(AssertionResult *)"Connect()","false","true",
                   expected_predicate_value);
        testing::internal::AssertHelper::AssertHelper
                  (&local_c8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x1247,(char *)local_b8._0_8_);
        testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_e0);
        testing::internal::AssertHelper::~AssertHelper(&local_c8);
        if ((SSL_SESSION *)local_b8._0_8_ != (SSL_SESSION *)local_a8) {
          operator_delete((void *)local_b8._0_8_,(ulong)(local_a8._0_8_ + 1));
        }
        if (local_e0._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_e0._M_head_impl + 8))();
        }
        if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_d0,local_d0);
        }
        goto LAB_0018f0be;
      }
      if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_d0,local_d0);
      }
      local_d8[0] = local_e2;
      local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (local_e2 == (internal)0x0) {
        testing::Message::Message((Message *)&local_e0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_b8,local_d8,(AssertionResult *)"read_seen","false","true",
                   expected_predicate_value);
        testing::internal::AssertHelper::AssertHelper
                  (&local_c8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x1249,(char *)local_b8._0_8_);
        testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_e0);
        testing::internal::AssertHelper::~AssertHelper(&local_c8);
        if ((SSL_SESSION *)local_b8._0_8_ != (SSL_SESSION *)local_a8) {
          operator_delete((void *)local_b8._0_8_,(ulong)(local_a8._0_8_ + 1));
        }
        if (local_e0._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_e0._M_head_impl + 8))();
        }
        if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_d0,local_d0);
        }
      }
      local_d8[0] = local_e3;
      local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (local_e3 == (internal)0x0) {
        testing::Message::Message((Message *)&local_e0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_b8,local_d8,(AssertionResult *)"write_seen","false","true",
                   expected_predicate_value);
        testing::internal::AssertHelper::AssertHelper
                  (&local_c8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x124a,(char *)local_b8._0_8_);
        testing::internal::AssertHelper::operator=(&local_c8,(Message *)&local_e0);
        testing::internal::AssertHelper::~AssertHelper(&local_c8);
        if ((undefined1 *)local_b8._0_8_ != local_a8) {
          operator_delete((void *)local_b8._0_8_,(ulong)(local_a8._0_8_ + 1));
        }
        if (local_e0._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_e0._M_head_impl + 8))();
        }
        if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_d0,local_d0);
        }
      }
      testing::ScopedTrace::~ScopedTrace(&local_e4);
      lVar4 = lVar4 + 1;
    } while (lVar4 != 2);
  }
  return;
}

Assistant:

TEST_P(SSLVersionTest, RecordCallback) {
  if (version() == DTLS1_3_VERSION) {
    // The DTLS 1.3 record header is vastly different than the TLS or DTLS < 1.3
    // header format. Instead of checking that the record header is formatted as
    // expected here, the runner implementation in dtls.go is strict about what
    // it accepts.
    return;
  }
  for (bool test_server : {true, false}) {
    SCOPED_TRACE(test_server);
    ASSERT_NO_FATAL_FAILURE(ResetContexts());

    bool read_seen = false;
    bool write_seen = false;
    auto cb = [&](int is_write, int cb_version, int cb_type, const void *buf,
                  size_t len, SSL *ssl) {
      if (cb_type != SSL3_RT_HEADER) {
        return;
      }

      // The callback does not report a version for records.
      EXPECT_EQ(0, cb_version);

      if (is_write) {
        write_seen = true;
      } else {
        read_seen = true;
      }

      // Sanity-check that the record header is plausible.
      CBS cbs;
      CBS_init(&cbs, reinterpret_cast<const uint8_t *>(buf), len);
      uint8_t type;
      uint16_t record_version, length;
      ASSERT_TRUE(CBS_get_u8(&cbs, &type));
      ASSERT_TRUE(CBS_get_u16(&cbs, &record_version));
      EXPECT_EQ(record_version >> 8, is_dtls() ? 0xfe : 0x03);
      if (is_dtls()) {
        uint16_t epoch;
        ASSERT_TRUE(CBS_get_u16(&cbs, &epoch));
        uint16_t max_epoch = 1;
        EXPECT_LE(epoch, max_epoch) << "Invalid epoch: " << epoch;
        ASSERT_TRUE(CBS_skip(&cbs, 6));
      }
      ASSERT_TRUE(CBS_get_u16(&cbs, &length));
      EXPECT_EQ(0u, CBS_len(&cbs));
    };
    using CallbackType = decltype(cb);
    SSL_CTX *ctx = test_server ? server_ctx_.get() : client_ctx_.get();
    SSL_CTX_set_msg_callback(
        ctx, [](int is_write, int cb_version, int cb_type, const void *buf,
                size_t len, SSL *ssl, void *arg) {
          CallbackType *cb_ptr = reinterpret_cast<CallbackType *>(arg);
          (*cb_ptr)(is_write, cb_version, cb_type, buf, len, ssl);
        });
    SSL_CTX_set_msg_callback_arg(ctx, &cb);

    ASSERT_TRUE(Connect());

    EXPECT_TRUE(read_seen);
    EXPECT_TRUE(write_seen);
  }
}